

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_analysis.cc
# Opt level: O3

void __thiscall pass_non_synthesizable_Test::TestBody(pass_non_synthesizable_Test *this)

{
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *pvVar1;
  bool bVar2;
  Generator *this_00;
  undefined1 local_1d0 [8];
  Context c;
  shared_ptr<kratos::DPIFunctionStmtBlock> dpi;
  shared_ptr<kratos::CombinationalStmtBlock> comb;
  shared_ptr<kratos::FunctionCallStmt> stmt;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  _Base_ptr local_38;
  _Alloc_hider local_30;
  
  local_1d0 = (undefined1  [8])&c.modules_._M_h._M_rehash_policy._M_next_resize;
  c.modules_._M_h._M_buckets = (__buckets_ptr)0x1;
  c.modules_._M_h._M_bucket_count = 0;
  c.modules_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  c.modules_._M_h._M_element_count._0_4_ = 0x3f800000;
  c.modules_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  c.modules_._M_h._M_rehash_policy._4_4_ = 0;
  c.modules_._M_h._M_rehash_policy._M_next_resize = 0;
  c.modules_._M_h._M_single_bucket =
       (__node_base_ptr)&c.generator_hash_._M_h._M_rehash_policy._M_next_resize;
  c.generator_hash_._M_h._M_buckets = (__buckets_ptr)0x1;
  c.generator_hash_._M_h._M_bucket_count = 0;
  c.generator_hash_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  c.generator_hash_._M_h._M_element_count._0_4_ = 0x3f800000;
  c.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&c.enum_defs_;
  c.enum_defs_._M_t._M_impl._0_4_ = 0;
  c.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  c.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  c.generator_hash_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  c.generator_hash_._M_h._M_rehash_policy._4_4_ = 0;
  c.generator_hash_._M_h._M_rehash_policy._M_next_resize = 0;
  c.generator_hash_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  c.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  c.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)&c.empty_generators_._M_h._M_rehash_policy._M_next_resize;
  c.empty_generators_._M_h._M_buckets = (__buckets_ptr)0x1;
  c.empty_generators_._M_h._M_bucket_count = 0;
  c.empty_generators_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  c.empty_generators_._M_h._M_element_count._0_4_ = 0x3f800000;
  c._224_8_ = &c.tracked_generators_._M_h._M_rehash_policy._M_next_resize;
  c.empty_generators_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  c.empty_generators_._M_h._M_rehash_policy._4_4_ = 0;
  c.empty_generators_._M_h._M_rehash_policy._M_next_resize = 0;
  c.empty_generators_._M_h._M_single_bucket._0_1_ = 0;
  c.tracked_generators_._M_h._M_buckets = (__buckets_ptr)0x1;
  c.tracked_generators_._M_h._M_bucket_count = 0;
  c.tracked_generators_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  c.tracked_generators_._M_h._M_element_count._0_4_ = 0x3f800000;
  c.tracked_generators_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  c.tracked_generators_._M_h._M_rehash_policy._4_4_ = 0;
  c.tracked_generators_._M_h._M_rehash_policy._M_next_resize = 0;
  c.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       c.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"mod","");
  this_00 = kratos::Context::generator((Context *)local_1d0,(string *)local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,local_48._M_allocated_capacity + 1);
  }
  kratos::Generator::combinational
            ((Generator *)
             &dpi.super___shared_ptr<kratos::DPIFunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"test_dpi","");
  kratos::Generator::dpi_function
            ((Generator *)&c.tracked_generators_._M_h._M_single_bucket,(string *)this_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,local_48._M_allocated_capacity + 1);
  }
  local_78._M_allocated_capacity = (size_type)&local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"test_dpi","");
  local_48._8_8_ = local_58 + 8;
  local_58._0_8_ = (pointer)0x0;
  local_58._8_8_ = (pointer)0x0;
  local_48._M_allocated_capacity = 0;
  local_30._M_p = (pointer)0x0;
  local_38 = (_Base_ptr)local_48._8_8_;
  kratos::Generator::call
            (this_00,(string *)&local_78,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
              *)local_58);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
               *)local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_allocated_capacity != &local_68) {
    operator_delete((void *)local_78._M_allocated_capacity,local_68._M_allocated_capacity + 1);
  }
  kratos::Var::as<kratos::FunctionCallVar>((Var *)local_58);
  std::__shared_ptr<kratos::FunctionCallStmt,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<kratos::FunctionCallStmt>,std::shared_ptr<kratos::FunctionCallVar>>
            ((__shared_ptr<kratos::FunctionCallStmt,(__gnu_cxx::_Lock_policy)2> *)
             &comb.super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(allocator<kratos::FunctionCallStmt> *)&local_78,
             (shared_ptr<kratos::FunctionCallVar> *)local_58);
  if ((pointer)local_58._8_8_ != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
  }
  local_58._0_8_ =
       comb.super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  local_58._8_8_ =
       stmt.super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (stmt.super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      pvVar1 = &((stmt.super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->super_Stmt).super_IRNode.fn_name_ln;
      *(int *)&(pvVar1->
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               )._M_impl.super__Vector_impl_data._M_start =
           *(int *)&(pvVar1->
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + 1;
      UNLOCK();
    }
    else {
      pvVar1 = &((stmt.super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->super_Stmt).super_IRNode.fn_name_ln;
      *(int *)&(pvVar1->
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               )._M_impl.super__Vector_impl_data._M_start =
           *(int *)&(pvVar1->
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + 1;
    }
  }
  kratos::StmtBlock::add_stmt
            ((StmtBlock *)
             dpi.super___shared_ptr<kratos::DPIFunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi,(shared_ptr<kratos::Stmt> *)local_58);
  if ((element_type *)local_58._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
  }
  local_58._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_analysis.cc";
  local_58._8_4_ = 0x23;
  std::
  vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
  ::emplace_back<std::pair<char_const*,int>>
            ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
              *)&(comb.
                  super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count,(pair<const_char_*,_int> *)local_58);
  local_48._M_allocated_capacity = 0;
  local_48._8_8_ = 0;
  local_58._8_8_ = (pointer)0x0;
  local_58._0_8_ = &local_48;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    kratos::check_non_synthesizable_content(this_00);
  }
  std::__cxx11::string::_M_replace((ulong)local_58,0,(char *)local_58._8_8_,0x23b2c2);
  testing::Message::Message((Message *)&local_78._M_allocated_capacity);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)
             &stmt.super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_analysis.cc"
             ,0x26,(char *)local_58._0_8_);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)
             &stmt.super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(Message *)&local_78._M_allocated_capacity);
  testing::internal::AssertHelper::~AssertHelper
            ((AssertHelper *)
             &stmt.super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_allocated_capacity !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    (**(code **)(*local_78._M_allocated_capacity + 8))();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,local_48._M_allocated_capacity + 1);
  }
  if (stmt.super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               stmt.super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ;
  }
  if (dpi.super___shared_ptr<kratos::DPIFunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               dpi.super___shared_ptr<kratos::DPIFunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
  }
  if (comb.super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               comb.super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
  }
  std::
  _Hashtable<kratos::Generator_*,_kratos::Generator_*,_std::allocator<kratos::Generator_*>,_std::__detail::_Identity,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<kratos::Generator_*,_kratos::Generator_*,_std::allocator<kratos::Generator_*>,_std::__detail::_Identity,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&c.track_generated_);
  std::
  _Hashtable<std::shared_ptr<kratos::Generator>,_std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::Generator>_>,_std::hash<std::shared_ptr<kratos::Generator>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::shared_ptr<kratos::Generator>,_std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::Generator>_>,_std::hash<std::shared_ptr<kratos::Generator>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&c.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>_>_>
               *)&c.max_instance_id_);
  std::
  _Hashtable<const_kratos::Generator_*,_std::pair<const_kratos::Generator_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Generator_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Generator_*>,_std::hash<const_kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<const_kratos::Generator_*,_std::pair<const_kratos::Generator_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Generator_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Generator_*>,_std::hash<const_kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&c.modules_._M_h._M_single_bucket);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_1d0);
  return;
}

Assistant:

TEST(pass, non_synthesizable) {  // NOLINT
    Context c;
    auto &mod = c.generator("mod");
    auto comb = mod.combinational();
    auto dpi = mod.dpi_function("test_dpi");
    auto &call = mod.call("test_dpi", std::map<std::string, std::shared_ptr<Var>>{});
    auto stmt = std::make_shared<FunctionCallStmt>(call.as<FunctionCallVar>());
    comb->add_stmt(stmt);
    // add debug info
    stmt->fn_name_ln.emplace_back(std::make_pair(__FILE__, __LINE__));

    // run the pass
    EXPECT_THROW(check_non_synthesizable_content(&mod), UserException);
}